

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O1

Hsh_IntMan_t * Hsh_IntManStart(Vec_Int_t *vData,int nSize,int nEntries)

{
  uint uVar1;
  Hsh_IntMan_t *pHVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  pHVar2 = (Hsh_IntMan_t *)calloc(1,0x20);
  pHVar2->nSize = nSize;
  pHVar2->vData = vData;
  uVar8 = nEntries - 1U;
  while( true ) {
    do {
      uVar7 = uVar8;
      uVar8 = uVar7 + 1;
    } while ((uVar7 & 1) != 0);
    if (uVar8 < 9) break;
    iVar6 = 5;
    while (uVar8 % (iVar6 - 2U) != 0) {
      uVar1 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar8 < uVar1) goto LAB_003f443a;
    }
  }
LAB_003f443a:
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  uVar1 = uVar8;
  if (uVar7 < 0xf) {
    uVar1 = 0x10;
  }
  pwVar5 = (word *)0x0;
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar1;
  __s = (int *)malloc((long)(int)uVar1 << 2);
  pVVar3->pArray = __s;
  pVVar3->nSize = uVar8;
  memset(__s,0xff,(long)(int)uVar8 << 2);
  pHVar2->vTable = pVVar3;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  if (nEntries - 1U < 0xf) {
    nEntries = 0x10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = nEntries;
  if (nEntries != 0) {
    pwVar5 = (word *)malloc((long)nEntries << 3);
  }
  pVVar4->pArray = pwVar5;
  pHVar2->vObjs = pVVar4;
  return pHVar2;
}

Assistant:

static inline Hsh_IntMan_t * Hsh_IntManStart( Vec_Int_t * vData, int nSize, int nEntries )
{
    Hsh_IntMan_t * p;
    p = ABC_CALLOC( Hsh_IntMan_t, 1 );
    p->nSize  = nSize;
    p->vData  = vData;
    p->vTable = Vec_IntStartFull( Abc_PrimeCudd(nEntries) );
    p->vObjs  = Vec_WrdAlloc( nEntries );
    return p;
}